

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O1

bool __thiscall
cmWhileFunctionBlocker::IsFunctionBlocked
          (cmWhileFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs;
  long lVar1;
  MessageType MVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  pointer pcVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  _Base_ptr p_Var13;
  ulong uVar14;
  bool bVar15;
  MessageType messageType;
  string err;
  string errorString;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_bc;
  string local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_68;
  undefined1 local_50 [32];
  
  iVar8 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"while");
  if (iVar8 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar8 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endwhile");
    if (iVar8 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_98,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar15 = (Internals *)local_98._0_8_ != (Internals *)0x0;
        p_Var13 = (_Base_ptr)local_98._0_8_;
        if (bVar15) {
          local_88._16_8_ = local_98._0_8_;
          local_98._0_8_ = local_88;
          local_98._8_8_ = 0;
          local_88[0] = _S_red;
          local_68.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.
          super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          inArgs = &this->Args;
          cmMakefile::ExpandArguments(mf,inArgs,&local_68,(char *)0x0);
          cmConditionEvaluator::cmConditionEvaluator((cmConditionEvaluator *)(local_50 + 8),mf);
          bVar5 = cmConditionEvaluator::IsTrue
                            ((cmConditionEvaluator *)(local_50 + 8),&local_68,(string *)local_98,
                             &local_bc);
          local_88._24_8_ = mf;
          local_50._0_8_ = inStatus;
          while (bVar5 != false) {
            if (local_98._8_8_ != 0) {
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_b8,"had incorrect arguments: ","");
              if ((this->Args).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (this->Args).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                uVar10 = 0;
                uVar14 = 1;
                do {
                  std::__cxx11::string::append((char *)&local_b8);
                  std::__cxx11::string::_M_append
                            ((char *)&local_b8,
                             (ulong)(inArgs->
                                    super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar10].Value.
                                    _M_dataplus._M_p);
                  std::__cxx11::string::append((char *)&local_b8);
                  std::__cxx11::string::append((char *)&local_b8);
                  uVar10 = ((long)(this->Args).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->Args).
                                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                           -0x5555555555555555;
                  bVar5 = uVar14 <= uVar10;
                  lVar1 = uVar10 - uVar14;
                  uVar10 = uVar14;
                  uVar14 = (ulong)((int)uVar14 + 1);
                } while (bVar5 && lVar1 != 0);
              }
              std::__cxx11::string::append((char *)&local_b8);
              mf = (cmMakefile *)local_88._24_8_;
              std::__cxx11::string::_M_append((char *)&local_b8,local_98._0_8_);
              std::__cxx11::string::append((char *)&local_b8);
              MVar2 = local_bc;
              cmMakefile::IssueMessage(mf,local_bc,&local_b8);
              if (MVar2 == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccured = true;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                break;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pcVar9 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((this->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish != pcVar9) {
              uVar10 = 0;
              uVar14 = 1;
              do {
                local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
                cmMakefile::ExecuteCommand(mf,pcVar9 + uVar10,(cmExecutionStatus *)&local_b8);
                if ((char)local_b8._M_dataplus._M_p == '\x01') {
                  inStatus->ReturnInvoked = true;
LAB_003fc9a4:
                  cVar6 = '\x01';
LAB_003fc9a9:
                  bVar7 = 0;
                }
                else {
                  if (local_b8._M_dataplus._M_p._1_1_ != '\0') goto LAB_003fc9a4;
                  if (local_b8._M_dataplus._M_p._2_1_ != '\0') {
                    cVar6 = '\a';
                    goto LAB_003fc9a9;
                  }
                  cVar6 = true;
                  if (cmSystemTools::s_FatalErrorOccured == false) {
                    cVar6 = cmSystemTools::GetInterruptFlag();
                  }
                  bVar7 = cVar6 ^ 1;
                }
                if (bVar7 == 0) goto LAB_003fca06;
                pcVar9 = (this->Functions).
                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar10 = ((long)(this->Functions).
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar9 >> 5) *
                         -0x5555555555555555;
                bVar5 = uVar14 <= uVar10;
                lVar1 = uVar10 - uVar14;
                uVar10 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar5 && lVar1 != 0);
              cVar6 = '\a';
LAB_003fca06:
              if (cVar6 != '\a') break;
            }
            pcVar4 = local_68.
                     super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar3 = local_68.
                     super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_68.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_68.
                super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              paVar11 = &((local_68.
                           super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           ._M_impl.super__Vector_impl_data._M_start)->Value).field_2;
              do {
                plVar12 = (long *)(((string *)(paVar11 + -1))->_M_dataplus)._M_p;
                if (paVar11 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)plVar12) {
                  operator_delete(plVar12,paVar11->_M_allocated_capacity + 1);
                }
                plVar12 = (long *)((long)paVar11 + 0x18);
                paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((long)paVar11 + 0x28);
              } while ((pointer)plVar12 != pcVar4);
              local_68.
              super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              ._M_impl.super__Vector_impl_data._M_finish = pcVar3;
              inStatus = (cmExecutionStatus *)local_50._0_8_;
            }
            mf = (cmMakefile *)local_88._24_8_;
            cmMakefile::ExpandArguments((cmMakefile *)local_88._24_8_,inArgs,&local_68,(char *)0x0);
            bVar5 = cmConditionEvaluator::IsTrue
                              ((cmConditionEvaluator *)(local_50 + 8),&local_68,(string *)local_98,
                               &local_bc);
          }
          std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
          ~vector(&local_68);
          p_Var13 = (_Base_ptr)local_88._16_8_;
          if ((Internals *)local_98._0_8_ != (Internals *)local_88) {
            operator_delete((void *)local_98._0_8_,CONCAT71(local_88._1_7_,local_88[0]) + 1);
            p_Var13 = (_Base_ptr)local_88._16_8_;
          }
        }
        if (p_Var13 == (_Base_ptr)0x0) {
          return bVar15;
        }
        (**(code **)(*(long *)p_Var13 + 0x18))();
        return bVar15;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmWhileFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // at end of for each execute recorded commands
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"while"))
    {
    // record the number of while commands past this one
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endwhile"))
    {
    // if this is the endwhile for this while loop then execute
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      std::string errorString;

      std::vector<cmExpandedCommandArgument> expandedArguments;
      mf.ExpandArguments(this->Args, expandedArguments);
      cmake::MessageType messageType;

      cmConditionEvaluator conditionEvaluator(mf);

      bool isTrue = conditionEvaluator.IsTrue(
        expandedArguments, errorString, messageType);

      while (isTrue)
        {
        if (!errorString.empty())
          {
          std::string err = "had incorrect arguments: ";
          unsigned int i;
          for(i =0; i < this->Args.size(); ++i)
            {
            err += (this->Args[i].Delim?"\"":"");
            err += this->Args[i].Value;
            err += (this->Args[i].Delim?"\"":"");
            err += " ";
            }
          err += "(";
          err += errorString;
          err += ").";
          mf.IssueMessage(messageType, err);
          if (messageType == cmake::FATAL_ERROR)
            {
            cmSystemTools::SetFatalErrorOccured();
            return true;
            }
          }

        // Invoke all the functions that were collected in the block.
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          cmExecutionStatus status;
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        expandedArguments.clear();
        mf.ExpandArguments(this->Args, expandedArguments);
        isTrue = conditionEvaluator.IsTrue(
          expandedArguments, errorString, messageType);
        }
      return true;
      }
    else
      {
      // decrement for each nested while that ends
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}